

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O2

void __thiscall cmXMLElement::cmXMLElement(cmXMLElement *this,cmXMLElement *par,char *tag)

{
  cmXMLWriter *this_00;
  allocator<char> local_31;
  string local_30;
  
  this_00 = par->xmlwr;
  this->xmlwr = this_00;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tag,&local_31);
  cmXMLWriter::StartElement(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

cmXMLElement(cmXMLElement& par, const char* tag)
    : xmlwr(par.xmlwr)
  {
    xmlwr.StartElement(tag);
  }